

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O1

void __thiscall zmq::dish_t::dish_t(dish_t *this,ctx_t *parent_,uint32_t tid_,int sid_)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int *piVar3;
  char *errmsg_;
  
  socket_base_t::socket_base_t(&this->super_socket_base_t,parent_,tid_,sid_,true);
  (this->super_socket_base_t).super_own_t.super_object_t._vptr_object_t =
       (_func_int **)&PTR__dish_t_00266a58;
  (this->super_socket_base_t).super_array_item_t<0>._vptr_array_item_t =
       (_func_int **)&PTR__dish_t_00266bc8;
  (this->super_socket_base_t).super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&PTR__dish_t_00266be8;
  (this->super_socket_base_t).super_i_pipe_events._vptr_i_pipe_events =
       (_func_int **)&PTR__dish_t_00266c20;
  fq_t::fq_t(&this->_fq);
  dist_t::dist_t(&this->_dist);
  p_Var1 = &(this->_subscriptions)._M_t._M_impl.super__Rb_tree_header;
  (this->_subscriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_subscriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_subscriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_subscriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_subscriptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_has_message = false;
  (this->super_socket_base_t).super_own_t.options.type = '\x0f';
  (this->super_socket_base_t).super_own_t.options.linger._value.super___atomic_base<int>._M_i = 0;
  iVar2 = msg_t::init(&this->_message,(EVP_PKEY_CTX *)parent_);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    errmsg_ = strerror(*piVar3);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
            ,0x30);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  return;
}

Assistant:

zmq::dish_t::dish_t (class ctx_t *parent_, uint32_t tid_, int sid_) :
    socket_base_t (parent_, tid_, sid_, true),
    _has_message (false)
{
    options.type = ZMQ_DISH;

    //  When socket is being closed down we don't want to wait till pending
    //  subscription commands are sent to the wire.
    options.linger.store (0);

    const int rc = _message.init ();
    errno_assert (rc == 0);
}